

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sturm.h
# Opt level: O0

int numchanges(int np,poly *sseq,double a)

{
  poly *ppVar1;
  double f;
  poly *s;
  double lf;
  int changes;
  double a_local;
  poly *sseq_local;
  int np_local;
  
  lf._4_4_ = 0;
  s = (poly *)evalpoly(sseq->ord,sseq->coef,a);
  for (f = (double)(sseq + 1); (ulong)f <= sseq + np; f = (double)((long)f + 0x210)) {
    ppVar1 = (poly *)evalpoly(*(int *)f,(double *)((long)f + 8),a);
    if ((((double)s == 0.0) && (!NAN((double)s))) || ((double)s * (double)ppVar1 < 0.0)) {
      lf._4_4_ = lf._4_4_ + 1;
    }
    s = ppVar1;
  }
  return lf._4_4_;
}

Assistant:

int numchanges(int np, poly *sseq, double a)
{
	int changes = 0;

	double lf = evalpoly(sseq[0].ord, sseq[0].coef, a);

	poly *s;
	for (s = sseq + 1; s <= sseq + np; s++) {
		double f = evalpoly(s->ord, s->coef, a);
		if (lf == 0.0 || lf * f < 0)
			changes++;
		lf = f;
	}

	return(changes);
}